

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O0

bool FIX::IntTConvertor<unsigned_int>::convert(const_iterator str,const_iterator end,uint *result)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  type tVar4;
  reference pcVar5;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var6;
  uint uStack_30;
  uchar c;
  type nx;
  type x;
  bool isNegative;
  uint *result_local;
  const_iterator end_local;
  const_iterator str_local;
  
  bVar1 = false;
  uStack_30 = 0;
  result_local = (uint *)end._M_current;
  end_local = str;
  bVar2 = __gnu_cxx::operator==
                    (&end_local,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&result_local);
  if (bVar2) {
    str_local._M_current._7_1_ = false;
  }
  else {
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&end_local);
    if (*pcVar5 == '-') {
      str_local._M_current._7_1_ = false;
    }
    else {
      pcVar5 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&end_local);
      if (*pcVar5 == '-') {
        bVar1 = true;
        p_Var6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&end_local);
        bVar2 = __gnu_cxx::operator==
                          (p_Var6,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&result_local);
        if (bVar2) {
          return false;
        }
      }
      do {
        if (0x19999999 < uStack_30) {
          return false;
        }
        pcVar5 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&end_local);
        if (9 < (byte)(*pcVar5 - 0x30U)) {
          return false;
        }
        uVar3 = uStack_30 * 10 + (uint)(byte)(*pcVar5 - 0x30U);
        if (uVar3 < uStack_30) {
          return false;
        }
        p_Var6 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(&end_local);
        bVar2 = __gnu_cxx::operator!=
                          (p_Var6,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)&result_local);
        uStack_30 = uVar3;
      } while (bVar2);
      if ((bVar1) && (tVar4 = _UNSIGNED_VALUE_OF<unsigned_int>(0), tVar4 < uVar3)) {
        str_local._M_current._7_1_ = false;
      }
      else {
        if (bVar1) {
          uStack_30 = -uVar3;
        }
        *result = uStack_30;
        str_local._M_current._7_1_ = true;
      }
    }
  }
  return str_local._M_current._7_1_;
}

Assistant:

static bool convert(std::string::const_iterator str, std::string::const_iterator end, T &result) {
    bool isNegative = false;
    typename std::make_unsigned<T>::type x = 0, nx = 0;

    if (str == end) {
      return false;
    }

    if (*str == '-' && std::is_unsigned<T>::value) {
      return false;
    }

    if (*str == '-') {
      isNegative = true;
      if (++str == end) {
        return false;
      }
    }

    do {
      if (x > OVERFLOW_MAX) {
        return false; // overflow
      }
      const unsigned char c = *str - '0';
      if (c > 9) {
        return false;
      }
      nx = 10 * x + c;
      if (nx < x) {
        return false; // overflow
      }
      x = nx;
    } while (++str != end);

    if (isNegative) {
      if (nx > UNSIGNED_VALUE_OF(VALUE_MIN)) {
        return false; // overflow
      }
    } else if (nx > VALUE_MAX) {
      return false; // overflow
    }

    PRAGMA_PUSH(4146);
    if (isNegative) {
      x = -x;
    }
    PRAGMA_POP;

    result = x;
    return true;
  }